

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midithru.c
# Opt level: O1

int main(int argc,char **argv)

{
  PmError PVar1;
  undefined8 in_RAX;
  int iVar2;
  PmEvent buffer;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  puts("begin PortMidi midithru program...");
  initialize();
  printf("%s\n%s\n","This program will run for 60 seconds, or until you play middle C,",
         "echoing all input with a 2 second delay.");
  if (499 < current_timestamp) {
    iVar2 = 500;
    do {
      while( true ) {
        PVar1 = Pm_Dequeue(in_queue,&uStack_18);
        if (PVar1 != pmGotData) break;
        uStack_18 = CONCAT44(uStack_18._4_4_ + 2000,(undefined4)uStack_18);
        Pm_Enqueue(out_queue,&uStack_18);
      }
      iVar2 = iVar2 + 500;
    } while (iVar2 <= current_timestamp);
  }
  do {
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    PmTimestamp last_time = 0;
    PmEvent buffer;

    /* determine what type of test to run */
    printf("begin PortMidi midithru program...\n");

    initialize(); /* set up and start midi processing */
	
    printf("%s\n%s\n",
           "This program will run for 60 seconds, or until you play middle C,",
           "echoing all input with a 2 second delay.");

    while (current_timestamp < 60000) {
        /* just to make the point that this is not a low-latency process,
           spin until half a second has elapsed */
        last_time = last_time + 500;
        while (last_time > current_timestamp) ;

        /* now read data and send it after changing timestamps */
        while (Pm_Dequeue(in_queue, &buffer) == 1) {
            /* printf("timestamp %d\n", buffer.timestamp); */
            /* printf("message %x\n", buffer.message); */
            buffer.timestamp = buffer.timestamp + 2000; /* delay */
            Pm_Enqueue(out_queue, &buffer);
            /* play middle C to break out of loop */
            if (Pm_MessageStatus(buffer.message) == 0x90 &&
                Pm_MessageData1(buffer.message) == 60) {
                goto quit_now;
            }
        }
    }
quit_now:
    finalize();
    exit_with_message("finished PortMidi midithru program.");
    return 0; /* never executed, but keeps the compiler happy */
}